

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.cpp
# Opt level: O3

char * crnlib::pixel_format_helpers::get_crn_format_string(crn_format fmt)

{
  if ((ulong)fmt < 0xf) {
    return &DAT_001b346c + *(int *)(&DAT_001b346c + fmt * 4);
  }
  return "?";
}

Assistant:

const char* get_crn_format_string(crn_format fmt) {
  switch (fmt) {
    case cCRNFmtDXT1:
      return "DXT1";
    case cCRNFmtDXT3:
      return "DXT3";
    case cCRNFmtDXT5:
      return "DXT5";
    case cCRNFmtDXT5_CCxY:
      return "DXT5_CCxY";
    case cCRNFmtDXT5_xGBR:
      return "DXT5_xGBR";
    case cCRNFmtDXT5_AGBR:
      return "DXT5_AGBR";
    case cCRNFmtDXT5_xGxR:
      return "DXT5_xGxR";
    case cCRNFmtDXN_XY:
      return "DXN_XY";
    case cCRNFmtDXN_YX:
      return "DXN_YX";
    case cCRNFmtDXT5A:
      return "DXT5A";
    case cCRNFmtETC1:
      return "ETC1";
    case cCRNFmtETC2:
      return "ETC2";
    case cCRNFmtETC2A:
      return "ETC2A";
    case cCRNFmtETC1S:
      return "ETC1S";
    case cCRNFmtETC2AS:
      return "ETC2AS";
    default:
      break;
  }
  CRNLIB_ASSERT(false);
  return "?";
}